

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [12];
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined4 uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  
  pBVar6 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  lVar24 = uVar5 * sVar8;
  lVar23 = (uVar5 + 1) * sVar8;
  lVar22 = (uVar5 + 2) * sVar8;
  lVar21 = (uVar5 + 3) * sVar8;
  aVar2 = (space->vx).field_0;
  aVar3 = (space->vy).field_0;
  aVar4 = (space->vz).field_0;
  uVar48 = *(undefined4 *)(pcVar7 + lVar24 + 8);
  auVar25._4_4_ = uVar48;
  auVar25._0_4_ = uVar48;
  auVar25._8_4_ = uVar48;
  auVar25._12_4_ = uVar48;
  auVar25 = vmulps_avx512vl((undefined1  [16])aVar4,auVar25);
  uVar48 = *(undefined4 *)(pcVar7 + lVar24 + 4);
  auVar26._4_4_ = uVar48;
  auVar26._0_4_ = uVar48;
  auVar26._8_4_ = uVar48;
  auVar26._12_4_ = uVar48;
  auVar25 = vfmadd231ps_avx512vl(auVar25,(undefined1  [16])aVar3,auVar26);
  uVar48 = *(undefined4 *)(pcVar7 + lVar24);
  auVar27._4_4_ = uVar48;
  auVar27._0_4_ = uVar48;
  auVar27._8_4_ = uVar48;
  auVar27._12_4_ = uVar48;
  auVar25 = vfmadd231ps_avx512vl(auVar25,(undefined1  [16])aVar2,auVar27);
  fVar1 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar9 = fVar1 * *(float *)(pcVar7 + lVar24 + 0xc);
  uVar48 = *(undefined4 *)(pcVar7 + lVar23 + 8);
  auVar28._4_4_ = uVar48;
  auVar28._0_4_ = uVar48;
  auVar28._8_4_ = uVar48;
  auVar28._12_4_ = uVar48;
  auVar26 = vmulps_avx512vl((undefined1  [16])aVar4,auVar28);
  uVar48 = *(undefined4 *)(pcVar7 + lVar23 + 4);
  auVar12._4_4_ = uVar48;
  auVar12._0_4_ = uVar48;
  auVar12._8_4_ = uVar48;
  auVar12._12_4_ = uVar48;
  auVar26 = vfmadd231ps_avx512vl(auVar26,(undefined1  [16])aVar3,auVar12);
  uVar48 = *(undefined4 *)(pcVar7 + lVar23);
  auVar13._4_4_ = uVar48;
  auVar13._0_4_ = uVar48;
  auVar13._8_4_ = uVar48;
  auVar13._12_4_ = uVar48;
  auVar26 = vfmadd231ps_avx512vl(auVar26,(undefined1  [16])aVar2,auVar13);
  fVar10 = fVar1 * *(float *)(pcVar7 + lVar23 + 0xc);
  uVar48 = *(undefined4 *)(pcVar7 + lVar22 + 8);
  auVar14._4_4_ = uVar48;
  auVar14._0_4_ = uVar48;
  auVar14._8_4_ = uVar48;
  auVar14._12_4_ = uVar48;
  auVar27 = vmulps_avx512vl((undefined1  [16])aVar4,auVar14);
  uVar48 = *(undefined4 *)(pcVar7 + lVar22 + 4);
  auVar15._4_4_ = uVar48;
  auVar15._0_4_ = uVar48;
  auVar15._8_4_ = uVar48;
  auVar15._12_4_ = uVar48;
  auVar27 = vfmadd231ps_avx512vl(auVar27,(undefined1  [16])aVar3,auVar15);
  uVar48 = *(undefined4 *)(pcVar7 + lVar22);
  auVar16._4_4_ = uVar48;
  auVar16._0_4_ = uVar48;
  auVar16._8_4_ = uVar48;
  auVar16._12_4_ = uVar48;
  auVar27 = vfmadd231ps_avx512vl(auVar27,(undefined1  [16])aVar2,auVar16);
  fVar11 = fVar1 * *(float *)(pcVar7 + lVar22 + 0xc);
  uVar48 = *(undefined4 *)(pcVar7 + lVar21 + 8);
  auVar17._4_4_ = uVar48;
  auVar17._0_4_ = uVar48;
  auVar17._8_4_ = uVar48;
  auVar17._12_4_ = uVar48;
  auVar28 = vmulps_avx512vl((undefined1  [16])aVar4,auVar17);
  uVar48 = *(undefined4 *)(pcVar7 + lVar21 + 4);
  auVar18._4_4_ = uVar48;
  auVar18._0_4_ = uVar48;
  auVar18._8_4_ = uVar48;
  auVar18._12_4_ = uVar48;
  auVar28 = vfmadd231ps_avx512vl(auVar28,(undefined1  [16])aVar3,auVar18);
  uVar48 = *(undefined4 *)(pcVar7 + lVar21);
  auVar19._4_4_ = uVar48;
  auVar19._0_4_ = uVar48;
  auVar19._8_4_ = uVar48;
  auVar19._12_4_ = uVar48;
  auVar28 = vfmadd231ps_avx512vl(auVar28,(undefined1  [16])aVar2,auVar19);
  uVar48 = auVar25._0_4_;
  auVar43._4_4_ = uVar48;
  auVar43._0_4_ = uVar48;
  auVar43._8_4_ = uVar48;
  auVar43._12_4_ = uVar48;
  auVar43._16_4_ = uVar48;
  auVar43._20_4_ = uVar48;
  auVar43._24_4_ = uVar48;
  auVar43._28_4_ = uVar48;
  auVar37._8_4_ = 1;
  auVar37._0_8_ = 0x100000001;
  auVar37._12_4_ = 1;
  auVar37._16_4_ = 1;
  auVar37._20_4_ = 1;
  auVar37._24_4_ = 1;
  auVar37._28_4_ = 1;
  auVar41 = vpermps_avx2(auVar37,ZEXT1632(auVar25));
  auVar32._8_4_ = 2;
  auVar32._0_8_ = 0x200000002;
  auVar32._12_4_ = 2;
  auVar32._16_4_ = 2;
  auVar32._20_4_ = 2;
  auVar32._24_4_ = 2;
  auVar32._28_4_ = 2;
  auVar44 = vpermps_avx2(auVar32,ZEXT1632(auVar25));
  auVar42._4_4_ = fVar9;
  auVar42._0_4_ = fVar9;
  auVar42._8_4_ = fVar9;
  auVar42._12_4_ = fVar9;
  auVar42._16_4_ = fVar9;
  auVar42._20_4_ = fVar9;
  auVar42._24_4_ = fVar9;
  auVar42._28_4_ = fVar9;
  uVar48 = auVar26._0_4_;
  auVar57._4_4_ = uVar48;
  auVar57._0_4_ = uVar48;
  auVar57._8_4_ = uVar48;
  auVar57._12_4_ = uVar48;
  auVar57._16_4_ = uVar48;
  auVar57._20_4_ = uVar48;
  auVar57._24_4_ = uVar48;
  auVar57._28_4_ = uVar48;
  auVar39 = vpermps_avx2(auVar37,ZEXT1632(auVar26));
  auVar40 = vpermps_avx2(auVar32,ZEXT1632(auVar26));
  auVar54._4_4_ = fVar10;
  auVar54._0_4_ = fVar10;
  auVar54._8_4_ = fVar10;
  auVar54._12_4_ = fVar10;
  auVar54._16_4_ = fVar10;
  auVar54._20_4_ = fVar10;
  auVar54._24_4_ = fVar10;
  auVar54._28_4_ = fVar10;
  uVar48 = auVar27._0_4_;
  auVar55._4_4_ = uVar48;
  auVar55._0_4_ = uVar48;
  auVar55._8_4_ = uVar48;
  auVar55._12_4_ = uVar48;
  auVar55._16_4_ = uVar48;
  auVar55._20_4_ = uVar48;
  auVar55._24_4_ = uVar48;
  auVar55._28_4_ = uVar48;
  auVar29 = vpermps_avx512vl(auVar37,ZEXT1632(auVar27));
  auVar38 = vpermps_avx2(auVar32,ZEXT1632(auVar27));
  auVar56._4_4_ = fVar11;
  auVar56._0_4_ = fVar11;
  auVar56._8_4_ = fVar11;
  auVar56._12_4_ = fVar11;
  auVar56._16_4_ = fVar11;
  auVar56._20_4_ = fVar11;
  auVar56._24_4_ = fVar11;
  auVar56._28_4_ = fVar11;
  auVar30 = vbroadcastss_avx512vl(auVar28);
  auVar31 = vpermps_avx512vl(auVar37,ZEXT1632(auVar28));
  auVar37 = vpermps_avx2(auVar32,ZEXT1632(auVar28));
  auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar1 * *(float *)(pcVar7 + lVar21 + 0xc))));
  auVar33 = vmulps_avx512vl(auVar30,catmullrom_basis0._3944_32_);
  auVar34 = vmulps_avx512vl(auVar31,catmullrom_basis0._3944_32_);
  auVar36._0_4_ = auVar37._0_4_ * catmullrom_basis0._3944_4_;
  auVar36._4_4_ = auVar37._4_4_ * catmullrom_basis0._3948_4_;
  auVar36._8_4_ = auVar37._8_4_ * catmullrom_basis0._3952_4_;
  auVar36._12_4_ = auVar37._12_4_ * catmullrom_basis0._3956_4_;
  auVar36._16_4_ = auVar37._16_4_ * catmullrom_basis0._3960_4_;
  auVar36._20_4_ = auVar37._20_4_ * catmullrom_basis0._3964_4_;
  auVar36._24_4_ = auVar37._24_4_ * catmullrom_basis0._3968_4_;
  auVar36._28_4_ = 0;
  auVar35 = vmulps_avx512vl(auVar32,catmullrom_basis0._3944_32_);
  auVar33 = vfmadd231ps_avx512vl(auVar33,catmullrom_basis0._2788_32_,auVar55);
  auVar34 = vfmadd231ps_avx512vl(auVar34,catmullrom_basis0._2788_32_,auVar29);
  auVar36 = vfmadd231ps_avx512vl(auVar36,catmullrom_basis0._2788_32_,auVar38);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar56,catmullrom_basis0._2788_32_);
  auVar33 = vfmadd231ps_avx512vl(auVar33,catmullrom_basis0._1632_32_,auVar57);
  auVar34 = vfmadd231ps_avx512vl(auVar34,catmullrom_basis0._1632_32_,auVar39);
  auVar36 = vfmadd231ps_avx512vl(auVar36,catmullrom_basis0._1632_32_,auVar40);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar54,catmullrom_basis0._1632_32_);
  auVar33 = vfmadd231ps_avx512vl(auVar33,catmullrom_basis0._476_32_,auVar43);
  auVar34 = vfmadd231ps_avx512vl(auVar34,catmullrom_basis0._476_32_,auVar41);
  auVar36 = vfmadd231ps_avx512vl(auVar36,catmullrom_basis0._476_32_,auVar44);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar42,catmullrom_basis0._476_32_);
  auVar30 = vmulps_avx512vl(auVar30,catmullrom_basis0._8568_32_);
  auVar31 = vmulps_avx512vl(auVar31,catmullrom_basis0._8568_32_);
  auVar37 = vmulps_avx512vl(auVar37,catmullrom_basis0._8568_32_);
  auVar32 = vmulps_avx512vl(auVar32,catmullrom_basis0._8568_32_);
  auVar30 = vfmadd231ps_avx512vl(auVar30,catmullrom_basis0._7412_32_,auVar55);
  auVar29 = vfmadd231ps_avx512vl(auVar31,catmullrom_basis0._7412_32_,auVar29);
  auVar38 = vfmadd231ps_avx512vl(auVar37,catmullrom_basis0._7412_32_,auVar38);
  auVar37 = vfmadd231ps_avx512vl(auVar32,catmullrom_basis0._7412_32_,auVar56);
  auVar30 = vfmadd231ps_avx512vl(auVar30,catmullrom_basis0._6256_32_,auVar57);
  auVar39 = vfmadd231ps_avx512vl(auVar29,catmullrom_basis0._6256_32_,auVar39);
  auVar40 = vfmadd231ps_avx512vl(auVar38,catmullrom_basis0._6256_32_,auVar40);
  auVar38 = vfmadd231ps_avx512vl(auVar37,catmullrom_basis0._6256_32_,auVar54);
  auVar37 = vfmadd231ps_avx512vl(auVar30,catmullrom_basis0._5100_32_,auVar43);
  auVar41 = vfmadd231ps_avx512vl(auVar39,catmullrom_basis0._5100_32_,auVar41);
  auVar39 = vfmadd231ps_avx512vl(auVar40,catmullrom_basis0._5100_32_,auVar44);
  auVar29._8_4_ = 0x3d638e39;
  auVar29._0_8_ = 0x3d638e393d638e39;
  auVar29._12_4_ = 0x3d638e39;
  auVar29._16_4_ = 0x3d638e39;
  auVar29._20_4_ = 0x3d638e39;
  auVar29._24_4_ = 0x3d638e39;
  auVar29._28_4_ = 0x3d638e39;
  auVar40 = vfmadd231ps_avx512vl(auVar38,catmullrom_basis0._5100_32_,auVar42);
  auVar32 = vmulps_avx512vl(auVar37,auVar29);
  auVar42 = vmulps_avx512vl(auVar41,auVar29);
  auVar31._4_4_ = auVar39._4_4_ * 0.055555556;
  auVar31._0_4_ = auVar39._0_4_ * 0.055555556;
  auVar31._8_4_ = auVar39._8_4_ * 0.055555556;
  auVar31._12_4_ = auVar39._12_4_ * 0.055555556;
  auVar31._16_4_ = auVar39._16_4_ * 0.055555556;
  auVar31._20_4_ = auVar39._20_4_ * 0.055555556;
  auVar31._24_4_ = auVar39._24_4_ * 0.055555556;
  auVar31._28_4_ = auVar44._28_4_;
  auVar43 = vmulps_avx512vl(auVar40,auVar29);
  auVar20 = ZEXT412(0);
  auVar41 = vblendps_avx(auVar32,ZEXT1232(auVar20) << 0x20,1);
  auVar44 = vblendps_avx(auVar42,ZEXT1232(auVar20) << 0x20,1);
  auVar50 = ZEXT1232(auVar20) << 0x20;
  auVar39 = vblendps_avx(auVar31,auVar50,1);
  auVar40 = vblendps_avx(auVar43,auVar50,1);
  auVar38 = vsubps_avx(auVar33,auVar41);
  auVar37 = vsubps_avx(auVar34,auVar44);
  auVar29 = vsubps_avx(auVar36,auVar39);
  auVar30 = vsubps_avx(auVar35,auVar40);
  auVar41 = vblendps_avx(auVar32,auVar50,0x80);
  auVar44 = vblendps_avx(auVar42,auVar50,0x80);
  auVar39 = vblendps_avx(auVar31,ZEXT1232(auVar20) << 0x20,0x80);
  auVar40 = vblendps_avx(auVar43,ZEXT1232(auVar20) << 0x20,0x80);
  auVar50._0_4_ = auVar33._0_4_ + auVar41._0_4_;
  auVar50._4_4_ = auVar33._4_4_ + auVar41._4_4_;
  auVar50._8_4_ = auVar33._8_4_ + auVar41._8_4_;
  auVar50._12_4_ = auVar33._12_4_ + auVar41._12_4_;
  auVar50._16_4_ = auVar33._16_4_ + auVar41._16_4_;
  auVar50._20_4_ = auVar33._20_4_ + auVar41._20_4_;
  auVar50._24_4_ = auVar33._24_4_ + auVar41._24_4_;
  auVar50._28_4_ = auVar33._28_4_ + auVar41._28_4_;
  auVar52._0_4_ = auVar34._0_4_ + auVar44._0_4_;
  auVar52._4_4_ = auVar34._4_4_ + auVar44._4_4_;
  auVar52._8_4_ = auVar34._8_4_ + auVar44._8_4_;
  auVar52._12_4_ = auVar34._12_4_ + auVar44._12_4_;
  auVar52._16_4_ = auVar34._16_4_ + auVar44._16_4_;
  auVar52._20_4_ = auVar34._20_4_ + auVar44._20_4_;
  auVar52._24_4_ = auVar34._24_4_ + auVar44._24_4_;
  auVar52._28_4_ = auVar34._28_4_ + auVar44._28_4_;
  auVar53._0_4_ = auVar36._0_4_ + auVar39._0_4_;
  auVar53._4_4_ = auVar36._4_4_ + auVar39._4_4_;
  auVar53._8_4_ = auVar36._8_4_ + auVar39._8_4_;
  auVar53._12_4_ = auVar36._12_4_ + auVar39._12_4_;
  auVar53._16_4_ = auVar36._16_4_ + auVar39._16_4_;
  auVar53._20_4_ = auVar36._20_4_ + auVar39._20_4_;
  auVar53._24_4_ = auVar36._24_4_ + auVar39._24_4_;
  auVar53._28_4_ = auVar36._28_4_ + auVar39._28_4_;
  auVar51._0_4_ = auVar35._0_4_ + auVar40._0_4_;
  auVar51._4_4_ = auVar35._4_4_ + auVar40._4_4_;
  auVar51._8_4_ = auVar35._8_4_ + auVar40._8_4_;
  auVar51._12_4_ = auVar35._12_4_ + auVar40._12_4_;
  auVar51._16_4_ = auVar35._16_4_ + auVar40._16_4_;
  auVar51._20_4_ = auVar35._20_4_ + auVar40._20_4_;
  auVar51._24_4_ = auVar35._24_4_ + auVar40._24_4_;
  auVar51._28_4_ = auVar35._28_4_ + auVar40._28_4_;
  auVar40._8_4_ = 0x7f800000;
  auVar40._0_8_ = 0x7f8000007f800000;
  auVar40._12_4_ = 0x7f800000;
  auVar40._16_4_ = 0x7f800000;
  auVar40._20_4_ = 0x7f800000;
  auVar40._24_4_ = 0x7f800000;
  auVar40._28_4_ = 0x7f800000;
  auVar41 = vminps_avx(auVar40,auVar33);
  auVar44 = vminps_avx(auVar40,auVar34);
  auVar39 = vminps_avx(auVar40,auVar36);
  auVar40 = vminps_avx(auVar40,auVar35);
  auVar31 = vminps_avx512vl(auVar38,auVar50);
  auVar31 = vminps_avx512vl(auVar41,auVar31);
  auVar41 = vminps_avx512vl(auVar37,auVar52);
  auVar32 = vminps_avx512vl(auVar44,auVar41);
  auVar41 = vminps_avx512vl(auVar29,auVar53);
  auVar42 = vminps_avx512vl(auVar39,auVar41);
  auVar41 = vminps_avx512vl(auVar30,auVar51);
  auVar43 = vminps_avx512vl(auVar40,auVar41);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar44 = vmaxps_avx512vl(auVar41,auVar33);
  auVar39 = vmaxps_avx512vl(auVar41,auVar34);
  auVar40 = vmaxps_avx512vl(auVar41,auVar36);
  auVar33 = vmaxps_avx512vl(auVar41,auVar35);
  auVar41 = vmaxps_avx(auVar38,auVar50);
  auVar41 = vmaxps_avx(auVar44,auVar41);
  auVar44 = vmaxps_avx(auVar37,auVar52);
  auVar44 = vmaxps_avx(auVar39,auVar44);
  auVar39 = vmaxps_avx(auVar29,auVar53);
  auVar39 = vmaxps_avx(auVar40,auVar39);
  auVar40 = vmaxps_avx(auVar30,auVar51);
  auVar40 = vmaxps_avx(auVar33,auVar40);
  auVar38 = vshufps_avx(auVar31,auVar31,0xb1);
  auVar38 = vminps_avx(auVar31,auVar38);
  auVar37 = vshufpd_avx(auVar38,auVar38,5);
  auVar38 = vminps_avx(auVar38,auVar37);
  auVar25 = vminps_avx(auVar38._0_16_,auVar38._16_16_);
  auVar38 = vshufps_avx(auVar32,auVar32,0xb1);
  auVar38 = vminps_avx(auVar32,auVar38);
  auVar37 = vshufpd_avx(auVar38,auVar38,5);
  auVar38 = vminps_avx(auVar38,auVar37);
  auVar26 = vminps_avx(auVar38._0_16_,auVar38._16_16_);
  auVar26 = vunpcklps_avx(auVar25,auVar26);
  auVar38 = vshufps_avx(auVar42,auVar42,0xb1);
  auVar38 = vminps_avx(auVar42,auVar38);
  auVar37 = vshufpd_avx(auVar38,auVar38,5);
  auVar38 = vminps_avx(auVar38,auVar37);
  auVar25 = vminps_avx(auVar38._0_16_,auVar38._16_16_);
  auVar27 = vinsertps_avx(auVar26,auVar25,0x28);
  auVar38 = vshufps_avx(auVar41,auVar41,0xb1);
  auVar41 = vmaxps_avx(auVar41,auVar38);
  auVar38 = vshufpd_avx(auVar41,auVar41,5);
  auVar41 = vmaxps_avx(auVar41,auVar38);
  auVar25 = vmaxps_avx(auVar41._0_16_,auVar41._16_16_);
  auVar41 = vshufps_avx(auVar44,auVar44,0xb1);
  auVar41 = vmaxps_avx(auVar44,auVar41);
  auVar44 = vshufpd_avx(auVar41,auVar41,5);
  auVar41 = vmaxps_avx(auVar41,auVar44);
  auVar26 = vmaxps_avx(auVar41._0_16_,auVar41._16_16_);
  auVar26 = vunpcklps_avx(auVar25,auVar26);
  auVar41 = vshufps_avx(auVar39,auVar39,0xb1);
  auVar41 = vmaxps_avx(auVar39,auVar41);
  auVar44 = vshufpd_avx(auVar41,auVar41,5);
  auVar41 = vmaxps_avx(auVar41,auVar44);
  auVar25 = vmaxps_avx(auVar41._0_16_,auVar41._16_16_);
  auVar28 = vinsertps_avx(auVar26,auVar25,0x28);
  auVar41 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar41 = vminps_avx(auVar43,auVar41);
  auVar44 = vshufpd_avx(auVar41,auVar41,5);
  auVar41 = vminps_avx(auVar41,auVar44);
  auVar25 = vminss_avx(auVar41._0_16_,auVar41._16_16_);
  auVar41 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar41 = vmaxps_avx(auVar40,auVar41);
  auVar44 = vshufpd_avx(auVar41,auVar41,5);
  auVar41 = vmaxps_avx(auVar41,auVar44);
  auVar26 = vmaxss_avx(auVar41._0_16_,auVar41._16_16_);
  auVar49._8_4_ = 0x7fffffff;
  auVar49._0_8_ = 0x7fffffff7fffffff;
  auVar49._12_4_ = 0x7fffffff;
  auVar25 = vandps_avx(auVar25,auVar49);
  auVar26 = vandps_avx(auVar26,auVar49);
  auVar25 = vmaxss_avx(auVar26,auVar25);
  auVar46._0_4_ = auVar25._0_4_;
  auVar46._4_4_ = auVar46._0_4_;
  auVar46._8_4_ = auVar46._0_4_;
  auVar46._12_4_ = auVar46._0_4_;
  auVar27 = vsubps_avx(auVar27,auVar46);
  auVar45._0_4_ = auVar28._0_4_ + auVar46._0_4_;
  auVar45._4_4_ = auVar28._4_4_ + auVar46._0_4_;
  auVar45._8_4_ = auVar28._8_4_ + auVar46._0_4_;
  auVar45._12_4_ = auVar28._12_4_ + auVar46._0_4_;
  auVar25 = vandps_avx(auVar27,auVar49);
  auVar26 = vandps_avx(auVar45,auVar49);
  auVar25 = vmaxps_avx(auVar25,auVar26);
  auVar26 = vmovshdup_avx(auVar25);
  auVar26 = vmaxss_avx(auVar26,auVar25);
  auVar25 = vshufpd_avx(auVar25,auVar25,1);
  auVar25 = vmaxss_avx(auVar25,auVar26);
  fVar1 = auVar25._0_4_ * 4.7683716e-07;
  auVar47._4_4_ = fVar1;
  auVar47._0_4_ = fVar1;
  auVar47._8_4_ = fVar1;
  auVar47._12_4_ = fVar1;
  aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar27,auVar47);
  (__return_storage_ptr__->lower).field_0 = aVar2;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar45._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar45._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar45._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar45._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const {
        return bounds(space,i);
      }